

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,secp256k1_ecdsa_signature *sig)

{
  secp256k1_ecdsa_signature *in_RCX;
  void *pvVar1;
  char *pcVar2;
  secp256k1_scalar s;
  secp256k1_scalar r;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x1b1,"test condition failed: ctx != NULL");
    abort();
  }
  if (output64 == (uchar *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "output64 != NULL";
  }
  else {
    if (sig != (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_signature_load((secp256k1_context *)&r,&s,(secp256k1_scalar *)sig,in_RCX);
      secp256k1_scalar_get_b32(output64,&r);
      secp256k1_scalar_get_b32(output64 + 0x20,&s);
      return 1;
    }
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "sig != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar1);
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}